

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

int * stirling2(int n,int m)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  
  if (m < 1 || n < 1) {
    return (int *)0x0;
  }
  piVar1 = (int *)operator_new__((ulong)(uint)(m * n) << 2);
  *piVar1 = 1;
  if (1 < (uint)m) {
    lVar2 = (ulong)(uint)m - 1;
    piVar4 = piVar1;
    do {
      piVar4 = piVar4 + (uint)n;
      *piVar4 = 0;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (1 < n) {
    uVar3 = 2;
    piVar4 = piVar1;
    do {
      piVar1[uVar3 - 1] = 1;
      if (1 < (uint)m) {
        uVar5 = 2;
        piVar6 = piVar4;
        do {
          piVar6[(ulong)(uint)n + 1] = piVar6[(uint)n] * (int)uVar5 + *piVar6;
          piVar6 = piVar6 + (uint)n;
          uVar5 = uVar5 + 1;
        } while (m + 1 != uVar5);
      }
      uVar3 = uVar3 + 1;
      piVar4 = piVar4 + 1;
    } while (uVar3 != n + 1);
  }
  return piVar1;
}

Assistant:

BURKHARDT_EXPORT
int *stirling2 ( int n, int m )

//****************************************************************************80
//
//  Purpose:
//
//    STIRLING2 computes the Stirling numbers of the second kind.
//
//  Discussion:
//
//    S2(N,M) represents the number of distinct partitions of N elements
//    into M nonempty sets.  For a fixed N, the sum of the Stirling
//    numbers S2(N,M) is represented by B(N), called "Bell's number",
//    and represents the number of distinct partitions of N elements.
//
//    For example, with 4 objects, there are:
//
//    1 partition into 1 set:
//
//      (A,B,C,D)
//
//    7 partitions into 2 sets:
//
//      (A,B,C) (D)
//      (A,B,D) (C)
//      (A,C,D) (B)
//      (A) (B,C,D)
//      (A,B) (C,D)
//      (A,C) (B,D)
//      (A,D) (B,C)
//
//    6 partitions into 3 sets:
//
//      (A,B) (C) (D)
//      (A) (B,C) (D)
//      (A) (B) (C,D)
//      (A,C) (B) (D)
//      (A,D) (B) (C)
//      (A) (B,D) (C)
//
//    1 partition into 4 sets:
//
//      (A) (B) (C) (D)
//
//    So S2(4,1) = 1, S2(4,2) = 7, S2(4,3) = 6, S2(4,4) = 1, and B(4) = 15.
//
//
//  First terms:
//
//    N/M: 1    2    3    4    5    6    7    8
//
//    1    1    0    0    0    0    0    0    0
//    2    1    1    0    0    0    0    0    0
//    3    1    3    1    0    0    0    0    0
//    4    1    7    6    1    0    0    0    0
//    5    1   15   25   10    1    0    0    0
//    6    1   31   90   65   15    1    0    0
//    7    1   63  301  350  140   21    1    0
//    8    1  127  966 1701 1050  266   28    1
//
//  Recursion:
//
//    S2(N,1) = 1 for all N.
//    S2(I,I) = 1 for all I.
//    S2(I,J) = 0 if I < J.
//
//    S2(N,M) = M * S2(N-1,M) + S2(N-1,M-1)
//
//  Properties:
//
//    sum ( 1 <= K <= M ) S2(I,K) * S1(K,J) = Delta(I,J)
//
//    X^N = sum ( 0 <= K <= N ) S2(N,K) X_K
//    where X_K is the falling factorial function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    25 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of rows of the table.
//
//    Input, int M, the number of columns of the table.
//
//    Output, int STIRLING2[N*M], the Stirling numbers of the second kind.
//
{
  int i;
  int j;
  int *s2;

  if ( n <= 0 )
  {
    return NULL;
  }

  if ( m <= 0 )
  {
    return NULL;
  }

  s2 = new int[n*m];

  s2[0+(0)*n] = 1;
  for ( j = 2; j <= m; j++ )
  {
    s2[0+(j-1)*n] = 0;
  }

  for ( i = 2; i <= n; i++ )
  {
    s2[i-1+(0)*n] = 1;

    for ( j = 2; j <= m; j++ )
    {
      s2[i-1+(j-1)*n] = j * s2[i-2+(j-1)*n] + s2[i-2+(j-2)*n];
    }

  }

  return s2;
}